

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorSet.cpp
# Opt level: O1

void __thiscall
myvk::DescriptorSet::UpdateStorageImage
          (DescriptorSet *this,Ptr<ImageView> *image_view,uint32_t binding,uint32_t array_element)

{
  PFN_vkUpdateDescriptorSets p_Var1;
  int iVar2;
  undefined4 extraout_var;
  VkDescriptorImageInfo info;
  VkWriteDescriptorSet write;
  VkDescriptorImageInfo local_78;
  VkWriteDescriptorSet local_58;
  
  p_Var1 = vkUpdateDescriptorSets;
  local_58.pImageInfo = &local_78;
  local_78.sampler = (VkSampler)0x0;
  local_78.imageView =
       ((image_view->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_image_view;
  local_78.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
  local_78._20_4_ = 0;
  local_58.pNext = (void *)0x0;
  local_58.pBufferInfo = (VkDescriptorBufferInfo *)0x0;
  local_58.pTexelBufferView = (VkBufferView *)0x0;
  local_58.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
  local_58._4_4_ = 0;
  local_58.dstSet = this->m_descriptor_set;
  local_58.dstArrayElement = array_element;
  local_58.dstBinding = binding;
  local_58.descriptorCount = 1;
  local_58.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
  iVar2 = (*(this->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  (*p_Var1)(*(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar2) + 0x268),1,&local_58,0,
            (VkCopyDescriptorSet *)0x0);
  return;
}

Assistant:

void DescriptorSet::UpdateStorageImage(const Ptr<ImageView> &image_view, uint32_t binding,
                                       uint32_t array_element) const {
	VkDescriptorImageInfo info = {};
	info.imageView = image_view->GetHandle();
	info.imageLayout = VK_IMAGE_LAYOUT_GENERAL;

	VkWriteDescriptorSet write = {};
	write.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
	write.dstSet = m_descriptor_set;
	write.dstBinding = binding;
	write.dstArrayElement = array_element;
	write.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
	write.descriptorCount = 1;
	write.pImageInfo = &info;

	vkUpdateDescriptorSets(GetDevicePtr()->GetHandle(), 1, &write, 0, nullptr);
}